

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall
BuildWithQueryDepsLogTest::BuildWithQueryDepsLogTest(BuildWithQueryDepsLogTest *this)

{
  (this->super_BuildTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__BuildWithQueryDepsLogTest_001f7a60;
  (this->super_BuildTest).super_BuildLogUser._vptr_BuildLogUser = (_func_int **)&DAT_001f7aa0;
  BuildTest::BuildTest(&this->super_BuildTest,&this->log_);
  (this->super_BuildTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__BuildWithQueryDepsLogTest_001f7a60;
  (this->super_BuildTest).super_BuildLogUser._vptr_BuildLogUser = (_func_int **)&DAT_001f7aa0;
  (this->temp_dir_).start_dir_._M_dataplus._M_p = (pointer)&(this->temp_dir_).start_dir_.field_2;
  (this->temp_dir_).start_dir_._M_string_length = 0;
  (this->temp_dir_).start_dir_.field_2._M_local_buf[0] = '\0';
  (this->temp_dir_).temp_dir_name_._M_dataplus._M_p =
       (pointer)&(this->temp_dir_).temp_dir_name_.field_2;
  (this->temp_dir_).temp_dir_name_._M_string_length = 0;
  (this->temp_dir_).temp_dir_name_.field_2._M_local_buf[0] = '\0';
  (this->log_).needs_recompaction_ = false;
  (this->log_).file_ = (FILE *)0x0;
  (this->log_).file_path_._M_dataplus._M_p = (pointer)&(this->log_).file_path_.field_2;
  (this->log_).file_path_._M_string_length = 0;
  (this->log_).file_path_.field_2._M_local_buf[0] = '\0';
  (this->log_).nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->log_).nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->log_).nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->log_).deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->log_).deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->log_).deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

BuildWithQueryDepsLogTest() : BuildTest(&log_) {
  }